

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_NtkMemory(Cba_Ntk_t *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  int nMem;
  Cba_Ntk_t *p_local;
  
  dVar1 = Vec_IntMemory(&p->vInputs);
  dVar2 = Vec_IntMemory(&p->vOutputs);
  dVar3 = Vec_IntMemory(&p->vOrder);
  dVar4 = Vec_IntMemory(&p->vSeq);
  dVar5 = Vec_StrMemory(&p->vObjType);
  dVar6 = Vec_IntMemory(&p->vObjFin0);
  dVar7 = Vec_IntMemory(&p->vObjFon0);
  dVar8 = Vec_IntMemory(&p->vFinFon);
  dVar9 = Vec_IntMemory(&p->vFonObj);
  dVar10 = Vec_IntMemory(&p->vObjCopy);
  dVar11 = Vec_IntMemory(&p->vObjFunc);
  dVar12 = Vec_IntMemory(&p->vObjName);
  dVar13 = Vec_IntMemory(&p->vObjAttr);
  dVar14 = Vec_IntMemory(&p->vAttrSto);
  dVar15 = Vec_IntMemory(&p->vFonCopy);
  dVar16 = Vec_IntMemory(&p->vFonName);
  dVar17 = Vec_IntMemory(&p->vFonRange);
  dVar18 = Vec_IntMemory(&p->vFonPrev);
  dVar19 = Vec_IntMemory(&p->vFonNext);
  dVar20 = Vec_IntMemory(&p->vFinFon0);
  dVar21 = Vec_IntMemory(&p->vFinObj);
  dVar22 = Vec_IntMemory(&p->vNtkObjs);
  dVar23 = Vec_IntMemory(&p->vFonBits);
  dVar24 = Vec_IntMemory(&p->vArray1);
  dVar25 = Vec_IntMemory(&p->vArray1);
  return (int)dVar25 +
         (int)dVar24 +
         (int)dVar23 +
         (int)dVar22 +
         (int)dVar21 +
         (int)dVar20 +
         (int)dVar19 +
         (int)dVar18 +
         (int)dVar17 +
         (int)dVar16 +
         (int)dVar15 +
         (int)dVar14 +
         (int)dVar13 +
         (int)dVar12 +
         (int)dVar11 +
         (int)dVar10 +
         (int)dVar9 +
         (int)dVar8 +
         (int)dVar7 +
         (int)dVar6 + (int)dVar5 + (int)dVar4 + (int)dVar3 + (int)dVar2 + (int)dVar1 + 0x1b0;
}

Assistant:

static inline int Cba_NtkMemory( Cba_Ntk_t * p )
{
    int nMem = sizeof(Cba_Ntk_t);
    // interface
    nMem += (int)Vec_IntMemory(&p->vInputs);
    nMem += (int)Vec_IntMemory(&p->vOutputs);
    nMem += (int)Vec_IntMemory(&p->vOrder);
    nMem += (int)Vec_IntMemory(&p->vSeq);
    // stucture
    nMem += (int)Vec_StrMemory(&p->vObjType);
    nMem += (int)Vec_IntMemory(&p->vObjFin0);
    nMem += (int)Vec_IntMemory(&p->vObjFon0);
    nMem += (int)Vec_IntMemory(&p->vFinFon);
    nMem += (int)Vec_IntMemory(&p->vFonObj);
    // optional
    nMem += (int)Vec_IntMemory(&p->vObjCopy );  
    nMem += (int)Vec_IntMemory(&p->vObjFunc );  
    nMem += (int)Vec_IntMemory(&p->vObjName );  
    nMem += (int)Vec_IntMemory(&p->vObjAttr );  
    nMem += (int)Vec_IntMemory(&p->vAttrSto );  
    nMem += (int)Vec_IntMemory(&p->vFonCopy );  
    nMem += (int)Vec_IntMemory(&p->vFonName );  
    nMem += (int)Vec_IntMemory(&p->vFonRange ); 
    nMem += (int)Vec_IntMemory(&p->vFonPrev );  
    nMem += (int)Vec_IntMemory(&p->vFonNext );  
    nMem += (int)Vec_IntMemory(&p->vFinFon0 );  
    nMem += (int)Vec_IntMemory(&p->vFinObj );   
    nMem += (int)Vec_IntMemory(&p->vNtkObjs );  
    nMem += (int)Vec_IntMemory(&p->vFonBits );  
    // other
    nMem += (int)Vec_IntMemory(&p->vArray1 );
    nMem += (int)Vec_IntMemory(&p->vArray1 );
    return nMem;
}